

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O1

bool __thiscall
pstore::command_line::
list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
::simple_value(list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
               *this,string *v)

{
  size_t *psVar1;
  int iVar2;
  literal *plVar3;
  bool bVar4;
  _List_node_base *p_Var5;
  long lVar6;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  __it;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  __it_00;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  _Var7;
  string *local_38;
  
  __it._M_current =
       (this->parser_).super_parser_base.literals_.
       super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
       ._M_impl.super__Vector_impl_data._M_start;
  plVar3 = (this->parser_).super_parser_base.literals_.
           super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = ((long)plVar3 - (long)__it._M_current >> 3) * -0x71c71c71c71c71c7 >> 2;
  __it_00._M_current = __it._M_current;
  local_38 = v;
  if (0 < lVar6) {
    __it_00._M_current = __it._M_current + lVar6 * 4;
    lVar6 = lVar6 + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)&local_38,__it);
      _Var7._M_current = __it._M_current;
      if (bVar4) goto LAB_00129c6b;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)&local_38,__it._M_current + 1);
      _Var7._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_00129c6b;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)&local_38,__it._M_current + 2);
      _Var7._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_00129c6b;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                            *)&local_38,__it._M_current + 3);
      _Var7._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_00129c6b;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = ((long)plVar3 - (long)__it_00._M_current >> 3) * -0x71c71c71c71c71c7;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      _Var7._M_current = plVar3;
      if ((lVar6 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
                  ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                                *)&local_38,__it_00), _Var7._M_current = __it_00._M_current, bVar4))
      goto LAB_00129c6b;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
            ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                          *)&local_38,__it_00);
    _Var7._M_current = __it_00._M_current;
    if (bVar4) goto LAB_00129c6b;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
          ::operator()((_Iter_pred<pstore::command_line::parser<(anonymous_namespace)::enumeration,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
                        *)&local_38,__it_00);
  _Var7._M_current = __it_00._M_current;
  if (!bVar4) {
    _Var7._M_current = plVar3;
  }
LAB_00129c6b:
  if (_Var7._M_current != plVar3) {
    iVar2 = (_Var7._M_current)->value;
    p_Var5 = (_List_node_base *)operator_new(0x18);
    *(int *)&p_Var5[1]._M_next = iVar2;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(this->values_).
              super__List_base<(anonymous_namespace)::enumeration,_std::allocator<(anonymous_namespace)::enumeration>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return _Var7._M_current != plVar3;
}

Assistant:

bool list<T, Parser>::simple_value (std::string const & v) {
            if (maybe<T> m = parser_ (v)) {
                values_.push_back (m.value ());
                return true;
            }
            return false;
        }